

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__build_huffman(stbi__huffman *h,int *count)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  long in_RSI;
  void *in_RDI;
  int m;
  int c;
  int s;
  uint code;
  int k;
  int j;
  int i;
  int local_28;
  int local_24;
  uint local_20;
  int local_1c;
  
  local_24 = 0;
  for (local_1c = 0; local_1c < 0x10; local_1c = local_1c + 1) {
    for (local_20 = 0; (int)local_20 < *(int *)(in_RSI + (long)local_1c * 4);
        local_20 = local_20 + 1) {
      *(char *)((long)in_RDI + (long)local_24 + 0x500) = (char)local_1c + '\x01';
      if (0x100 < local_24 + 1) {
        iVar3 = stbi__err("bad size list");
        return iVar3;
      }
      local_24 = local_24 + 1;
    }
  }
  *(undefined1 *)((long)in_RDI + (long)local_24 + 0x500) = 0;
  local_28 = 0;
  local_24 = 0;
  local_20 = 1;
  do {
    if (0x10 < (int)local_20) {
      *(undefined4 *)((long)in_RDI + (long)(int)local_20 * 4 + 0x604) = 0xffffffff;
      memset(in_RDI,0xff,0x200);
      for (local_1c = 0; local_1c < local_24; local_1c = local_1c + 1) {
        bVar1 = *(byte *)((long)in_RDI + (long)local_1c + 0x500);
        if (bVar1 < 10) {
          uVar2 = *(ushort *)((long)in_RDI + (long)local_1c * 2 + 0x200);
          for (local_20 = 0; (int)local_20 < 1 << (9 - bVar1 & 0x1f); local_20 = local_20 + 1) {
            *(char *)((long)in_RDI + (long)(int)(((uint)uVar2 << (9 - bVar1 & 0x1f)) + local_20)) =
                 (char)local_1c;
          }
        }
      }
      return 1;
    }
    *(int *)((long)in_RDI + (long)(int)local_20 * 4 + 0x64c) = local_24 - local_28;
    if (*(byte *)((long)in_RDI + (long)local_24 + 0x500) == local_20) {
      while (*(byte *)((long)in_RDI + (long)local_24 + 0x500) == local_20) {
        *(short *)((long)in_RDI + (long)local_24 * 2 + 0x200) = (short)local_28;
        local_28 = local_28 + 1;
        local_24 = local_24 + 1;
      }
      if ((uint)(1 << ((byte)local_20 & 0x1f)) <= local_28 - 1U) {
        iVar3 = stbi__err("bad code lengths");
        return iVar3;
      }
    }
    *(int *)((long)in_RDI + (long)(int)local_20 * 4 + 0x604) =
         local_28 << (0x10 - (byte)local_20 & 0x1f);
    local_28 = local_28 << 1;
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

static int stbi__build_huffman(stbi__huffman *h, int *count)
{
   int i,j,k=0;
   unsigned int code;
   // build size list for each symbol (from JPEG spec)
   for (i=0; i < 16; ++i) {
      for (j=0; j < count[i]; ++j) {
         h->size[k++] = (stbi_uc) (i+1);
         if(k >= 257) return stbi__err("bad size list","Corrupt JPEG");
      }
   }
   h->size[k] = 0;

   // compute actual symbols (from jpeg spec)
   code = 0;
   k = 0;
   for(j=1; j <= 16; ++j) {
      // compute delta to add to code to compute symbol id
      h->delta[j] = k - code;
      if (h->size[k] == j) {
         while (h->size[k] == j)
            h->code[k++] = (stbi__uint16) (code++);
         if (code-1 >= (1u << j)) return stbi__err("bad code lengths","Corrupt JPEG");
      }
      // compute largest code + 1 for this size, preshifted as needed later
      h->maxcode[j] = code << (16-j);
      code <<= 1;
   }
   h->maxcode[j] = 0xffffffff;

   // build non-spec acceleration table; 255 is flag for not-accelerated
   memset(h->fast, 255, 1 << FAST_BITS);
   for (i=0; i < k; ++i) {
      int s = h->size[i];
      if (s <= FAST_BITS) {
         int c = h->code[i] << (FAST_BITS-s);
         int m = 1 << (FAST_BITS-s);
         for (j=0; j < m; ++j) {
            h->fast[c+j] = (stbi_uc) i;
         }
      }
   }
   return 1;
}